

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringCommand.cxx
# Opt level: O0

bool __thiscall
cmStringCommand::RegexReplace
          (cmStringCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  int n_00;
  cmMakefile *this_00;
  bool bVar1;
  const_reference pvVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *r_00;
  size_type sVar6;
  size_type sVar7;
  size_type sVar8;
  reference pvVar9;
  size_type sVar10;
  string local_508 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  undefined1 local_488 [8];
  string e_3;
  size_type len;
  size_type end;
  size_type start;
  int n;
  uint i;
  undefined1 local_408 [8];
  string e_2;
  size_type r_1;
  size_type l2;
  size_type base;
  string output;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_370;
  undefined1 local_360 [8];
  string input;
  undefined1 local_320 [8];
  string e_1;
  RegularExpression re;
  allocator local_209;
  undefined1 local_208 [8];
  string e;
  RegexReplacement local_1c0;
  RegexReplacement local_198;
  undefined4 local_170;
  allocator local_169;
  string local_168;
  string local_148;
  RegexReplacement local_128;
  string local_100;
  RegexReplacement local_e0;
  size_type local_b8;
  size_type r;
  size_type l;
  vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  replacement;
  string outvar;
  undefined1 local_60 [8];
  string replace;
  string regex;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmStringCommand *this_local;
  
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,2);
  std::__cxx11::string::string((string *)(replace.field_2._M_local_buf + 8),(string *)pvVar2);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,3);
  std::__cxx11::string::string((string *)local_60,(string *)pvVar2);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,4);
  std::__cxx11::string::string
            ((string *)
             &replacement.
              super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pvVar2);
  std::vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  ::vector((vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
            *)&l);
  r = 0;
  while (sVar6 = r, uVar3 = std::__cxx11::string::length(), sVar6 < uVar3) {
    local_b8 = std::__cxx11::string::find(local_60,0x918771);
    if (local_b8 == 0xffffffffffffffff) {
      local_b8 = std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)&local_100,(ulong)local_60);
      RegexReplacement::RegexReplacement(&local_e0,&local_100);
      std::
      vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
      ::push_back((vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                   *)&l,&local_e0);
      RegexReplacement::~RegexReplacement(&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
    }
    else {
      if (local_b8 != r) {
        std::__cxx11::string::substr((ulong)&local_148,(ulong)local_60);
        RegexReplacement::RegexReplacement(&local_128,&local_148);
        std::
        vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
        ::push_back((vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                     *)&l,&local_128);
        RegexReplacement::~RegexReplacement(&local_128);
        std::__cxx11::string::~string((string *)&local_148);
      }
      sVar6 = local_b8;
      lVar4 = std::__cxx11::string::length();
      if (sVar6 == lVar4 - 1U) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_168,
                   "sub-command REGEX, mode REPLACE: replace-expression ends in a backslash.",
                   &local_169);
        cmCommand::SetError(&this->super_cmCommand,&local_168);
        std::__cxx11::string::~string((string *)&local_168);
        std::allocator<char>::~allocator((allocator<char> *)&local_169);
        this_local._7_1_ = false;
        local_170 = 1;
        goto LAB_00558119;
      }
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_60);
      if ((*pcVar5 < '0') ||
         (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_60), '9' < *pcVar5)) {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_60);
        if (*pcVar5 == 'n') {
          RegexReplacement::RegexReplacement(&local_1c0,"\n");
          std::
          vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
          ::push_back((vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                       *)&l,&local_1c0);
          RegexReplacement::~RegexReplacement(&local_1c0);
        }
        else {
          pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_60);
          if (*pcVar5 != '\\') {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)local_208,"sub-command REGEX, mode REPLACE: Unknown escape \"",
                       &local_209);
            std::allocator<char>::~allocator((allocator<char> *)&local_209);
            std::__cxx11::string::substr((ulong)&re.searchstring,(ulong)local_60);
            std::__cxx11::string::operator+=((string *)local_208,(string *)&re.searchstring);
            std::__cxx11::string::~string((string *)&re.searchstring);
            std::__cxx11::string::operator+=((string *)local_208,"\" in replace-expression.");
            cmCommand::SetError(&this->super_cmCommand,(string *)local_208);
            this_local._7_1_ = false;
            local_170 = 1;
            std::__cxx11::string::~string((string *)local_208);
            goto LAB_00558119;
          }
          RegexReplacement::RegexReplacement((RegexReplacement *)((long)&e.field_2 + 8),"\\");
          std::
          vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
          ::push_back((vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                       *)&l,(value_type *)((long)&e.field_2 + 8));
          RegexReplacement::~RegexReplacement((RegexReplacement *)((long)&e.field_2 + 8));
        }
      }
      else {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_60);
        RegexReplacement::RegexReplacement(&local_198,*pcVar5 + -0x30);
        std::
        vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
        ::push_back((vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                     *)&l,&local_198);
        RegexReplacement::~RegexReplacement(&local_198);
      }
      local_b8 = local_b8 + 2;
    }
    r = local_b8;
  }
  cmMakefile::ClearMatches((this->super_cmCommand).Makefile);
  cmsys::RegularExpression::RegularExpression((RegularExpression *)((long)&e_1.field_2 + 8));
  pcVar5 = (char *)std::__cxx11::string::c_str();
  bVar1 = cmsys::RegularExpression::compile((RegularExpression *)((long)&e_1.field_2 + 8),pcVar5);
  if (bVar1) {
    local_370 = cmMakeRange<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                          (args);
    r_00 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::advance(&local_370,5);
    std::__cxx11::string::string((string *)(output.field_2._M_local_buf + 8));
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              ((string *)local_360,r_00,(string *)(output.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)&base);
    l2 = 0;
    while( true ) {
      lVar4 = std::__cxx11::string::c_str();
      bVar1 = cmsys::RegularExpression::find
                        ((RegularExpression *)((long)&e_1.field_2 + 8),(char *)(lVar4 + l2));
      if (!bVar1) break;
      cmMakefile::StoreMatches
                ((this->super_cmCommand).Makefile,(RegularExpression *)((long)&e_1.field_2 + 8));
      sVar6 = cmsys::RegularExpression::start((RegularExpression *)((long)&e_1.field_2 + 8));
      sVar7 = cmsys::RegularExpression::end((RegularExpression *)((long)&e_1.field_2 + 8));
      std::__cxx11::string::substr((ulong)((long)&e_2.field_2 + 8),(ulong)local_360);
      std::__cxx11::string::operator+=((string *)&base,(string *)(e_2.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(e_2.field_2._M_local_buf + 8));
      if (sVar7 == sVar6) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&n,
                       "sub-command REGEX, mode REPLACE regex \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&replace.field_2 + 8));
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_408,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&n,
                       "\" matched an empty string.");
        std::__cxx11::string::~string((string *)&n);
        cmCommand::SetError(&this->super_cmCommand,(string *)local_408);
        this_local._7_1_ = false;
        local_170 = 1;
        std::__cxx11::string::~string((string *)local_408);
        goto LAB_005580c9;
      }
      start._4_4_ = 0;
      while( true ) {
        sVar8 = std::
                vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                ::size((vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                        *)&l);
        if (sVar8 <= start._4_4_) break;
        pvVar9 = std::
                 vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                 ::operator[]((vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                               *)&l,(ulong)start._4_4_);
        if (pvVar9->number < 0) {
          pvVar9 = std::
                   vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                   ::operator[]((vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                                 *)&l,(ulong)start._4_4_);
          std::__cxx11::string::operator+=((string *)&base,(string *)&pvVar9->value);
        }
        else {
          pvVar9 = std::
                   vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                   ::operator[]((vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                                 *)&l,(ulong)start._4_4_);
          n_00 = pvVar9->number;
          sVar6 = cmsys::RegularExpression::start
                            ((RegularExpression *)((long)&e_1.field_2 + 8),n_00);
          sVar10 = cmsys::RegularExpression::end((RegularExpression *)((long)&e_1.field_2 + 8),n_00)
          ;
          lVar4 = std::__cxx11::string::length();
          if ((((sVar6 == 0xffffffffffffffff) || (sVar10 == 0xffffffffffffffff)) ||
              (lVar4 - l2 < sVar6)) || (lVar4 - l2 < sVar10)) {
            std::operator+(&local_4e8,"sub-command REGEX, mode REPLACE: replace expression \"",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_60);
            std::operator+(&local_4c8,&local_4e8,"\" contains an out-of-range escape for regex \"");
            std::operator+(&local_4a8,&local_4c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&replace.field_2 + 8));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_488,&local_4a8,"\".");
            std::__cxx11::string::~string((string *)&local_4a8);
            std::__cxx11::string::~string((string *)&local_4c8);
            std::__cxx11::string::~string((string *)&local_4e8);
            cmCommand::SetError(&this->super_cmCommand,(string *)local_488);
            this_local._7_1_ = false;
            local_170 = 1;
            std::__cxx11::string::~string((string *)local_488);
            goto LAB_005580c9;
          }
          std::__cxx11::string::substr((ulong)((long)&e_3.field_2 + 8),(ulong)local_360);
          std::__cxx11::string::operator+=((string *)&base,(string *)(e_3.field_2._M_local_buf + 8))
          ;
          std::__cxx11::string::~string((string *)(e_3.field_2._M_local_buf + 8));
        }
        start._4_4_ = start._4_4_ + 1;
      }
      l2 = sVar7 + l2;
    }
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_508,(ulong)local_360);
    std::__cxx11::string::operator+=((string *)&base,local_508);
    std::__cxx11::string::~string(local_508);
    this_00 = (this->super_cmCommand).Makefile;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmMakefile::AddDefinition
              (this_00,(string *)
                       &replacement.
                        super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,pcVar5);
    this_local._7_1_ = true;
    local_170 = 1;
LAB_005580c9:
    std::__cxx11::string::~string((string *)&base);
    std::__cxx11::string::~string((string *)local_360);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&input.field_2 + 8),
                   "sub-command REGEX, mode REPLACE failed to compile regex \"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&replace.field_2 + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&input.field_2 + 8),"\".");
    std::__cxx11::string::~string((string *)(input.field_2._M_local_buf + 8));
    cmCommand::SetError(&this->super_cmCommand,(string *)local_320);
    this_local._7_1_ = false;
    local_170 = 1;
    std::__cxx11::string::~string((string *)local_320);
  }
  cmsys::RegularExpression::~RegularExpression((RegularExpression *)((long)&e_1.field_2 + 8));
LAB_00558119:
  std::vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
  ::~vector((vector<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
             *)&l);
  std::__cxx11::string::~string
            ((string *)
             &replacement.
              super__Vector_base<cmStringCommand::RegexReplacement,_std::allocator<cmStringCommand::RegexReplacement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(replace.field_2._M_local_buf + 8));
  return this_local._7_1_;
}

Assistant:

bool cmStringCommand::RegexReplace(std::vector<std::string> const& args)
{
  //"STRING(REGEX REPLACE <regular_expression> <replace_expression>
  // <output variable> <input> [<input>...])\n"
  std::string regex = args[2];
  std::string replace = args[3];
  std::string outvar = args[4];

  // Pull apart the replace expression to find the escaped [0-9] values.
  std::vector<RegexReplacement> replacement;
  std::string::size_type l = 0;
  while(l < replace.length())
    {
    std::string::size_type r = replace.find("\\", l);
    if(r == std::string::npos)
      {
      r = replace.length();
      replacement.push_back(replace.substr(l, r-l));
      }
    else
      {
      if(r-l > 0)
        {
        replacement.push_back(replace.substr(l, r-l));
        }
      if(r == (replace.length()-1))
        {
        this->SetError("sub-command REGEX, mode REPLACE: "
                       "replace-expression ends in a backslash.");
        return false;
        }
      if((replace[r+1] >= '0') && (replace[r+1] <= '9'))
        {
        replacement.push_back(replace[r+1]-'0');
        }
      else if(replace[r+1] == 'n')
        {
        replacement.push_back("\n");
        }
      else if(replace[r+1] == '\\')
        {
        replacement.push_back("\\");
        }
      else
        {
        std::string e = "sub-command REGEX, mode REPLACE: Unknown escape \"";
        e += replace.substr(r, 2);
        e += "\" in replace-expression.";
        this->SetError(e);
        return false;
        }
      r += 2;
      }
    l = r;
    }

  this->Makefile->ClearMatches();
  // Compile the regular expression.
  cmsys::RegularExpression re;
  if(!re.compile(regex.c_str()))
    {
    std::string e =
      "sub-command REGEX, mode REPLACE failed to compile regex \""+
      regex+"\".";
    this->SetError(e);
    return false;
    }

  // Concatenate all the last arguments together.
  std::string input = cmJoin(cmMakeRange(args).advance(5), std::string());

  // Scan through the input for all matches.
  std::string output;
  std::string::size_type base = 0;
  while(re.find(input.c_str()+base))
    {
    this->Makefile->StoreMatches(re);
    std::string::size_type l2 = re.start();
    std::string::size_type r = re.end();

    // Concatenate the part of the input that was not matched.
    output += input.substr(base, l2);

    // Make sure the match had some text.
    if(r-l2 == 0)
      {
      std::string e = "sub-command REGEX, mode REPLACE regex \""+
        regex+"\" matched an empty string.";
      this->SetError(e);
      return false;
      }

    // Concatenate the replacement for the match.
    for(unsigned int i=0; i < replacement.size(); ++i)
      {
      if(replacement[i].number < 0)
        {
        // This is just a plain-text part of the replacement.
        output += replacement[i].value;
        }
      else
        {
        // Replace with part of the match.
        int n = replacement[i].number;
        std::string::size_type start = re.start(n);
        std::string::size_type end = re.end(n);
        std::string::size_type len = input.length()-base;
        if((start != std::string::npos) && (end != std::string::npos) &&
           (start <= len) && (end <= len))
          {
          output += input.substr(base+start, end-start);
          }
        else
          {
          std::string e =
            "sub-command REGEX, mode REPLACE: replace expression \""+
            replace+"\" contains an out-of-range escape for regex \""+
            regex+"\".";
          this->SetError(e);
          return false;
          }
        }
      }

    // Move past the match.
    base += r;
    }

  // Concatenate the text after the last match.
  output += input.substr(base, input.length()-base);

  // Store the output in the provided variable.
  this->Makefile->AddDefinition(outvar, output.c_str());
  return true;
}